

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void monty_mul_into(MontyContext *mc,mp_int *r,mp_int *x,mp_int *y)

{
  ulong uVar1;
  mp_int scratch_00;
  mp_int scratch;
  mp_int reduced;
  mp_int tmp;
  mp_int local_68;
  mp_int local_50;
  mp_int local_40;
  
  uVar1 = mc->rw;
  if (uVar1 < x->nw) {
    __assert_fail("x->nw <= mc->rw",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x5c4,"void monty_mul_into(MontyContext *, mp_int *, mp_int *, mp_int *)");
  }
  if (y->nw <= uVar1) {
    local_68.nw = mc->scratch->nw;
    local_68.w = mc->scratch->w;
    local_40 = mp_alloc_from_scratch(&local_68,uVar1 * 2);
    mp_mul_into(&local_40,x,y);
    scratch_00.w = local_68.w;
    scratch_00.nw = local_68.nw;
    local_50 = monty_reduce_internal(mc,&local_40,scratch_00);
    mp_copy_into(r,&local_50);
    mp_clear(mc->scratch);
    return;
  }
  __assert_fail("y->nw <= mc->rw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x5c5,"void monty_mul_into(MontyContext *, mp_int *, mp_int *, mp_int *)");
}

Assistant:

void monty_mul_into(MontyContext *mc, mp_int *r, mp_int *x, mp_int *y)
{
    assert(x->nw <= mc->rw);
    assert(y->nw <= mc->rw);

    mp_int scratch = *mc->scratch;
    mp_int tmp = mp_alloc_from_scratch(&scratch, 2*mc->rw);
    mp_mul_into(&tmp, x, y);
    mp_int reduced = monty_reduce_internal(mc, &tmp, scratch);
    mp_copy_into(r, &reduced);
    mp_clear(mc->scratch);
}